

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strarr.h
# Opt level: O1

void __thiscall
StrArr::StrArr(StrArr *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *strings)

{
  size_t sVar1;
  char **ppcVar2;
  pointer pbVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  sVar1 = lVar6 >> 5;
  this->size_ = sVar1;
  ppcVar2 = (char **)operator_new__(-(ulong)(sVar1 + 1 >> 0x3d != 0) | sVar1 * 8 + 8);
  (this->array_)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl = ppcVar2;
  *(undefined8 *)((long)ppcVar2 + (lVar6 >> 2)) = 0;
  pbVar3 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((strings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pcVar4 = strdup(*(char **)((long)&(pbVar3->_M_dataplus)._M_p + lVar6));
      (this->array_)._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t.
      super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
      super__Head_base<0UL,_char_**,_false>._M_head_impl[uVar5] = pcVar4;
      uVar5 = uVar5 + 1;
      pbVar3 = (strings->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)(strings->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5))
    ;
  }
  return;
}

Assistant:

explicit StrArr(const std::vector<std::string>& strings)
      : size_(strings.size()), array_(new char*[size_ + 1]) {
    array_[size_] = NULL;
    for (size_t i = 0; i < strings.size(); i++) {
      // Can't use c_str() directly because array_ is not const char*.
      array_[i] = strdup(strings[i].c_str());
    }
  }

  ~StrArr() {
    // unique_ptr frees the array of pointers but not the pointed-to strings.
    for (int i = 0; i < size_; i++) {
      free(array_[i]);
    }
  }